

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

void __thiscall duckdb::QueryProfiler::EndPhase(QueryProfiler *this)

{
  long lVar1;
  int iVar2;
  rep rVar3;
  mapped_type *pmVar4;
  pointer pMVar5;
  MetricsType *phase;
  pointer __k;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true))
       && (this->running == true)) {
      rVar3 = ::std::chrono::_V2::steady_clock::now();
      (this->phase_profiler).end.__d.__r = rVar3;
      (this->phase_profiler).finished = true;
      __k = (this->phase_stack).
            super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
            super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
            super__Vector_impl_data._M_start;
      pMVar5 = (this->phase_stack).
               super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
               super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (__k != pMVar5) {
        do {
          if ((this->phase_profiler).finished == true) {
            rVar3 = (this->phase_profiler).end.__d.__r;
          }
          else {
            rVar3 = ::std::chrono::_V2::steady_clock::now();
          }
          lVar1 = (this->phase_profiler).start.__d.__r;
          pmVar4 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_double>,_std::allocator<std::pair<const_duckdb::MetricsType,_double>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_double>,_std::allocator<std::pair<const_duckdb::MetricsType,_double>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->phase_timings,__k);
          *pmVar4 = (double)(rVar3 - lVar1) / 1000000000.0 + *pmVar4;
          __k = __k + 1;
        } while (__k != pMVar5);
        __k = (this->phase_stack).
              super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
              super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
              super__Vector_impl_data._M_start;
        pMVar5 = (this->phase_stack).
                 super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
                 super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
      super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
      super__Vector_impl_data._M_finish = pMVar5 + -1;
      if (__k != pMVar5 + -1) {
        (this->phase_profiler).finished = false;
        rVar3 = ::std::chrono::_V2::steady_clock::now();
        (this->phase_profiler).start.__d.__r = rVar3;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void QueryProfiler::EndPhase() {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}
	D_ASSERT(!phase_stack.empty());

	// end the timer
	phase_profiler.End();
	// add the timing to all currently active phases
	for (auto &phase : phase_stack) {
		phase_timings[phase] += phase_profiler.Elapsed();
	}
	// now remove the last added phase
	phase_stack.pop_back();

	if (!phase_stack.empty()) {
		phase_profiler.Start();
	}
}